

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

ExprTree * __thiscall
PcodeCompile::createOpOutUnary(PcodeCompile *this,VarnodeTpl *outvn,OpCode opc,ExprTree *vn)

{
  OpTpl *this_00;
  VarnodeTpl *this_01;
  OpTpl *op;
  
  this_00 = (OpTpl *)operator_new(0x28);
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->opc = opc;
  this_00->output = (VarnodeTpl *)0x0;
  op = this_00;
  OpTpl::addInput(this_00,vn->outvn);
  this_00->output = outvn;
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back(vn->ops,&op);
  this_01 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_01,outvn);
  vn->outvn = this_01;
  return vn;
}

Assistant:

ExprTree *PcodeCompile::createOpOutUnary(VarnodeTpl *outvn,OpCode opc,ExprTree *vn)

{ // Create an op with explicit output and 1 input
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn->outvn);
  op->setOutput(outvn);
  vn->ops->push_back(op);
  vn->outvn = new VarnodeTpl(*outvn);
  return vn;
}